

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

PassToken __thiscall spvtools::CreateLoopFissionPass(spvtools *this,size_t threshold)

{
  unique_ptr<spvtools::opt::LoopFissionPass,_std::default_delete<spvtools::opt::LoopFissionPass>_>
  local_28;
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_20;
  size_t local_18;
  size_t threshold_local;
  
  local_18 = threshold;
  threshold_local = (size_t)this;
  MakeUnique<spvtools::opt::LoopFissionPass,unsigned_long&>((spvtools *)&local_28,&local_18);
  MakeUnique<spvtools::Optimizer::PassToken::Impl,std::unique_ptr<spvtools::opt::LoopFissionPass,std::default_delete<spvtools::opt::LoopFissionPass>>>
            ((spvtools *)&local_20,&local_28);
  Optimizer::PassToken::PassToken((PassToken *)this,&local_20);
  std::
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ::~unique_ptr(&local_20);
  std::
  unique_ptr<spvtools::opt::LoopFissionPass,_std::default_delete<spvtools::opt::LoopFissionPass>_>::
  ~unique_ptr(&local_28);
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )this;
}

Assistant:

Optimizer::PassToken CreateLoopFissionPass(size_t threshold) {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::LoopFissionPass>(threshold));
}